

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
::do_get_arg(format_arg *__return_storage_ptr__,
            context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            *this,uint arg_id)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  type tVar6;
  format_error *this_00;
  
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::do_get(__return_storage_ptr__,&this->args_,arg_id);
  tVar6 = __return_storage_ptr__->type_;
  if (tVar6 == named_arg_type) {
    lVar1 = (__return_storage_ptr__->value_).field_0.long_long_value;
    iVar2 = *(int *)(lVar1 + 0x10);
    uVar3 = *(undefined4 *)(lVar1 + 0x14);
    uVar4 = *(undefined4 *)(lVar1 + 0x18);
    uVar5 = *(undefined4 *)(lVar1 + 0x1c);
    tVar6 = *(type *)(lVar1 + 0x20);
    __return_storage_ptr__->type_ = tVar6;
    (__return_storage_ptr__->value_).field_0.int_value = iVar2;
    *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 4) = uVar3;
    *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 8) = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->value_).field_0 + 0xc) = uVar5;
  }
  if (tVar6 != none_type) {
    return __return_storage_ptr__;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"argument index out of range");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

format_arg do_get_arg(unsigned arg_id) {
    format_arg arg = args_.get(arg_id);
    if (!arg)
      parse_context_.on_error("argument index out of range");
    return arg;
  }